

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor
          (ZLIBBufferCompressor *this,int level)

{
  int iVar1;
  ostream *poVar2;
  CompressorException *this_00;
  string sStack_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  (this->super_BufferCompressor)._vptr_BufferCompressor = (_func_int **)&PTR_Compress_001e7b48;
  ByteBuffer::ByteBuffer(&this->buffer_,0x2000);
  (this->stream_).next_in = (Bytef *)0x0;
  (this->stream_).avail_in = 0;
  (this->stream_).zalloc = (alloc_func)0x0;
  (this->stream_).zfree = (free_func)0x0;
  (this->stream_).opaque = (voidpf)0x0;
  iVar1 = deflateInit2_(&this->stream_,level,8,0xfffffff1,8,0,"1.2.11",0x70);
  if (iVar1 == 0) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"problem occurred while deflating init: ZLIB_ERROR_CODE(",0x37);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  this_00 = (CompressorException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  exceptions::CompressorException::CompressorException(this_00,&sStack_1c8);
  __cxa_throw(this_00,&exceptions::CompressorException::typeinfo,
              exceptions::BidFXException::~BidFXException);
}

Assistant:

ZLIBBufferCompressor::ZLIBBufferCompressor(int level)
{
    /* allocate deflate state */
    stream_.zalloc = Z_NULL;
    stream_.zfree = Z_NULL;
    stream_.opaque = Z_NULL;
    stream_.next_in = Z_NULL;
    stream_.avail_in = Z_NULL;
    int ret = deflateInit2(&stream_, level, Z_DEFLATED, -MAX_WBITS, 8, Z_DEFAULT_STRATEGY);
    if (ret != Z_OK)
    {
        std::stringstream ss;
        ss << "problem occurred while deflating init: ZLIB_ERROR_CODE(" << ret << ")";
        throw CompressorException(ss.str());
    }
}